

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O3

CURLUcode curl_url_set(CURLU *u,CURLUPart what,char *part,uint flags)

{
  byte bVar1;
  char *__s;
  uint uVar2;
  byte bVar3;
  byte bVar4;
  char cVar5;
  int iVar6;
  CURLcode CVar7;
  CURLUcode CVar8;
  size_t sVar9;
  Curl_handler *pCVar10;
  long lVar11;
  char *pcVar12;
  uint uVar13;
  uint uVar14;
  size_t buflen;
  size_t sVar15;
  dynbuf *mem;
  uchar *i;
  bool bVar16;
  char *decoded;
  char *oldurl;
  uchar out [3];
  uint local_a0;
  CURLU *local_98;
  char *local_88;
  dynbuf local_80;
  uint local_5c;
  char *local_58;
  dynbuf local_50;
  
  if (u == (CURLU *)0x0) {
    return CURLUE_BAD_HANDLE;
  }
  local_58 = part;
  if (part == (char *)0x0) {
    switch(what) {
    case CURLUPART_URL:
      free_urlhandle(u);
      u->query = (char *)0x0;
      u->fragment = (char *)0x0;
      u->port = (char *)0x0;
      u->path = (char *)0x0;
      u->host = (char *)0x0;
      u->zoneid = (char *)0x0;
      u->password = (char *)0x0;
      u->options = (char *)0x0;
      u->scheme = (char *)0x0;
      u->user = (char *)0x0;
      *(undefined8 *)&u->portnum = 0;
      return CURLUE_OK;
    case CURLUPART_SCHEME:
      u->field_0x52 = u->field_0x52 & 0xfb;
      break;
    case CURLUPART_USER:
      u = (CURLU *)&u->user;
      break;
    case CURLUPART_PASSWORD:
      u = (CURLU *)&u->password;
      break;
    case CURLUPART_OPTIONS:
      u = (CURLU *)&u->options;
      break;
    case CURLUPART_HOST:
      u = (CURLU *)&u->host;
      break;
    case CURLUPART_PORT:
      u->portnum = 0;
      u = (CURLU *)&u->port;
      break;
    case CURLUPART_PATH:
      u = (CURLU *)&u->path;
      break;
    case CURLUPART_QUERY:
      u->field_0x52 = u->field_0x52 & 0xfe;
      u = (CURLU *)&u->query;
      break;
    case CURLUPART_FRAGMENT:
      u->field_0x52 = u->field_0x52 & 0xfd;
      u = (CURLU *)&u->fragment;
      break;
    case CURLUPART_ZONEID:
      u = (CURLU *)&u->zoneid;
      break;
    default:
      goto switchD_001640ce_default;
    }
    if (u->scheme != (char *)0x0) {
      (*Curl_cfree)(u->scheme);
      u->scheme = (char *)0x0;
      return CURLUE_OK;
    }
    return CURLUE_OK;
  }
  sVar9 = strlen(part);
  if (8000000 < sVar9) {
    return CURLUE_MALFORMED_INPUT;
  }
  if (CURLUPART_ZONEID < what) {
switchD_001640ce_default:
    return CURLUE_UNKNOWN_PART;
  }
  bVar3 = (byte)flags >> 7;
  switch(what) {
  case CURLUPART_URL:
    if (sVar9 == 0) {
      return CURLUE_MALFORMED_INPUT;
    }
    sVar15 = Curl_is_absolute_url(part,(char *)0x0,buflen,(flags & 0x204) != 0);
    if ((sVar15 == 0) &&
       (CVar8 = curl_url_get(u,CURLUPART_URL,&local_80.bufr,flags), CVar8 == CURLUE_OK)) {
      CVar8 = redirect_url((char *)CONCAT62(local_80.bufr._2_6_,(unsigned_short)local_80.bufr),part,
                           u,flags);
      (*Curl_cfree)((void *)CONCAT62(local_80.bufr._2_6_,(unsigned_short)local_80.bufr));
      return CVar8;
    }
    CVar8 = parseurl_and_replace(part,u,flags);
    return CVar8;
  case CURLUPART_SCHEME:
    if (sVar9 - 0x29 < 0xffffffffffffffd8) {
      return CURLUE_BAD_SCHEME;
    }
    if (((flags & 8) == 0) &&
       (pCVar10 = Curl_get_scheme_handler(part), pCVar10 == (Curl_handler *)0x0)) {
      return CURLUE_UNSUPPORTED_SCHEME;
    }
    if (0x19 < (byte)((*part & 0xdfU) + 0xbf)) {
      return CURLUE_BAD_SCHEME;
    }
    if (sVar9 != 1) {
      lVar11 = 0;
      do {
        bVar3 = part[lVar11];
        if ((9 < (byte)(bVar3 - 0x30)) && (0x19 < (byte)((bVar3 & 0xdf) + 0xbf))) {
          if (0x2e < bVar3) {
            return CURLUE_BAD_SCHEME;
          }
          if ((0x680000000000U >> ((ulong)bVar3 & 0x3f) & 1) == 0) {
            return CURLUE_BAD_SCHEME;
          }
        }
        lVar11 = lVar11 + 1;
      } while (sVar9 - 1 != lVar11);
    }
    u->field_0x52 = u->field_0x52 & 0xfb;
    bVar16 = true;
    local_a0 = 0;
    uVar13 = 0;
    bVar3 = 0;
    local_98 = u;
    goto LAB_0016433f;
  case CURLUPART_USER:
    local_98 = (CURLU *)&u->user;
    break;
  case CURLUPART_PASSWORD:
    local_98 = (CURLU *)&u->password;
    break;
  case CURLUPART_OPTIONS:
    local_98 = (CURLU *)&u->options;
    break;
  case CURLUPART_HOST:
    local_98 = (CURLU *)&u->host;
    (*Curl_cfree)(u->zoneid);
    u->zoneid = (char *)0x0;
    break;
  case CURLUPART_PORT:
    if (9 < (byte)(*part - 0x30U)) {
      return CURLUE_BAD_PORT_NUMBER;
    }
    iVar6 = Curl_str_number(&local_58,(curl_off_t *)&local_80,0xffff);
    if (iVar6 != 0) {
      return CURLUE_BAD_PORT_NUMBER;
    }
    if (*local_58 != '\0') {
      return CURLUE_BAD_PORT_NUMBER;
    }
    pcVar12 = curl_maprintf("%ld",CONCAT62(local_80.bufr._2_6_,(unsigned_short)local_80.bufr));
    if (pcVar12 == (char *)0x0) {
      return CURLUE_OUT_OF_MEMORY;
    }
    (*Curl_cfree)(u->port);
    u->port = pcVar12;
    u->portnum = (unsigned_short)local_80.bufr;
    return CURLUE_OK;
  case CURLUPART_PATH:
    local_98 = (CURLU *)&u->path;
    uVar13 = 0x180901;
    local_a0 = 0;
    bVar16 = true;
    goto LAB_0016433f;
  case CURLUPART_QUERY:
    bVar16 = -1 < (char)(byte)flags;
    local_a0 = flags >> 8;
    local_98 = (CURLU *)&u->query;
    u->field_0x52 = u->field_0x52 | 1;
    goto LAB_0016433d;
  case CURLUPART_FRAGMENT:
    u->field_0x52 = u->field_0x52 | 2;
    local_98 = (CURLU *)&u->fragment;
    break;
  case CURLUPART_ZONEID:
    local_98 = (CURLU *)&u->zoneid;
  }
  bVar16 = true;
  local_a0 = 0;
LAB_0016433d:
  uVar13 = 0;
LAB_0016433f:
  local_5c = uVar13;
  Curl_dyn_init(&local_80,(ulong)(uVar13 & 0xff) + sVar9 * 3 + 1);
  if (((char)uVar13 != '\0') && (*part != '/')) {
    CVar7 = Curl_dyn_addn(&local_80,"/",1);
    CVar8 = CURLUE_OUT_OF_MEMORY;
    if (CVar7 == CURLE_TOO_LARGE) {
      CVar8 = CURLUE_TOO_LARGE;
    }
    if (CVar7 != CURLE_OK) {
      return CVar8;
    }
  }
  if (bVar3 == 0) {
    CVar7 = Curl_dyn_add(&local_80,part);
    if (CVar7 == CURLE_OK) {
      pcVar12 = Curl_dyn_ptr(&local_80);
      do {
        lVar11 = 1;
        if (*pcVar12 == '%') {
          bVar4 = pcVar12[1];
          if (((((byte)(bVar4 - 0x30) < 10) ||
               ((bVar4 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(bVar4 - 0x41) & 0x3f) & 1) != 0)
                ))) && ((bVar1 = pcVar12[2], (byte)(bVar1 - 0x30) < 10 ||
                        ((bVar1 - 0x41 < 0x26 &&
                         ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) != 0)))))) &&
             ((byte)(bVar4 + 0xbf) < 0x1a || (byte)(bVar1 + 0xbf) < 0x1a)) {
            cVar5 = Curl_raw_tolower(bVar4);
            pcVar12[1] = cVar5;
            cVar5 = Curl_raw_tolower(pcVar12[2]);
            pcVar12[2] = cVar5;
            lVar11 = 3;
          }
        }
        else if (*pcVar12 == '\0') goto LAB_00164560;
        pcVar12 = pcVar12 + lVar11;
      } while( true );
    }
LAB_001644a3:
    if (CVar7 == CURLE_TOO_LARGE) {
      return CURLUE_TOO_LARGE;
    }
    return CURLUE_OUT_OF_MEMORY;
  }
  bVar4 = *part;
  if (bVar4 != 0) {
    uVar13 = local_a0;
    do {
      if ((bool)(bVar4 != 0x20 | bVar16)) {
        if (((byte)(bVar4 - 0x30) < 10) || ((byte)((bVar4 & 0xdf) + 0xbf) < 0x1a)) {
LAB_00164420:
          uVar14 = uVar13 & 0xff;
          uVar2 = uVar14;
          if ((uVar13 & 1) != 0) {
            uVar2 = 0;
          }
          uVar13 = uVar2;
          if (bVar4 != 0x3d) {
            uVar13 = uVar14;
          }
          sVar15 = 1;
          mem = (dynbuf *)part;
        }
        else {
          if (bVar4 < 0x3d) {
            if ((1 < bVar4 - 0x2d) && ((bVar4 != 0x2f || ((char)local_5c == '\0'))))
            goto LAB_00164468;
            goto LAB_00164420;
          }
          if (bVar4 == 0x3d) {
            if ((uVar13 & 1) != 0) goto LAB_00164420;
          }
          else if ((bVar4 == 0x5f) || (bVar4 == 0x7e)) goto LAB_00164420;
LAB_00164468:
          local_50.bufr._2_1_ = 0;
          local_50.bufr._0_2_ = 0x25;
          Curl_hexbyte((uchar *)((long)&local_50.bufr + 1),bVar4,true);
          sVar15 = 3;
          mem = &local_50;
        }
        CVar7 = Curl_dyn_addn(&local_80,mem,sVar15);
        if (CVar7 != CURLE_OK) goto LAB_001644a3;
      }
      else {
        CVar7 = Curl_dyn_addn(&local_80,"+",1);
        if (CVar7 != CURLE_OK) {
          return CURLUE_OUT_OF_MEMORY;
        }
      }
      bVar4 = *(byte *)((long)&((dynbuf *)part)->bufr + 1);
      part = (char *)((long)&((dynbuf *)part)->bufr + 1);
    } while (bVar4 != 0);
  }
LAB_00164560:
  pcVar12 = Curl_dyn_ptr(&local_80);
  if (((byte)local_a0 & pcVar12 != (char *)0x0) == 1) {
    __s = u->query;
    if ((__s != (char *)0x0) && (sVar9 = strlen(__s), sVar9 != 0)) {
      cVar5 = __s[sVar9 - 1];
      Curl_dyn_init(&local_50,8000000);
      CVar7 = Curl_dyn_addn(&local_50,u->query,sVar9);
      if ((CVar7 == CURLE_OK) &&
         (((cVar5 == '&' || (CVar7 = Curl_dyn_addn(&local_50,"&",1), CVar7 == CURLE_OK)) &&
          (CVar7 = Curl_dyn_add(&local_50,pcVar12), CVar7 == CURLE_OK)))) {
        Curl_dyn_free(&local_80);
        (*Curl_cfree)(local_98->scheme);
        pcVar12 = Curl_dyn_ptr(&local_50);
        local_98->scheme = pcVar12;
        return CURLUE_OK;
      }
      Curl_dyn_free(&local_80);
      return CURLUE_OUT_OF_MEMORY;
    }
  }
  else if ((what == CURLUPART_HOST) &&
          (sVar15 = Curl_dyn_len(&local_80), ((byte)(flags >> 10) & sVar15 == 0) == 0)) {
    if (sVar15 == 0) {
LAB_001646d7:
      Curl_dyn_free(&local_80);
      return CURLUE_BAD_HOSTNAME;
    }
    if (bVar3 == 0) {
      local_88 = (char *)0x0;
      CVar7 = Curl_urldecode(pcVar12,sVar15,&local_88,(size_t *)&local_50,REJECT_CTRL);
      if ((CVar7 != CURLE_OK) ||
         (CVar8 = hostname_check(u,local_88,
                                 CONCAT53(local_50.bufr._3_5_,
                                          CONCAT12(local_50.bufr._2_1_,local_50.bufr._0_2_))),
         CVar8 != CURLUE_OK)) {
        (*Curl_cfree)(local_88);
        goto LAB_001646d7;
      }
      (*Curl_cfree)(local_88);
    }
    else {
      CVar8 = hostname_check(u,pcVar12,sVar15);
      if (CVar8 != CURLUE_OK) goto LAB_001646d7;
    }
  }
  (*Curl_cfree)(local_98->scheme);
  local_98->scheme = pcVar12;
  return CURLUE_OK;
}

Assistant:

CURLUcode curl_url_set(CURLU *u, CURLUPart what,
                       const char *part, unsigned int flags)
{
  char **storep = NULL;
  bool urlencode = (flags & CURLU_URLENCODE) ? 1 : 0;
  bool plusencode = FALSE;
  bool urlskipslash = FALSE;
  bool leadingslash = FALSE;
  bool appendquery = FALSE;
  bool equalsencode = FALSE;
  size_t nalloc;

  if(!u)
    return CURLUE_BAD_HANDLE;
  if(!part) {
    /* setting a part to NULL clears it */
    switch(what) {
    case CURLUPART_URL:
      break;
    case CURLUPART_SCHEME:
      storep = &u->scheme;
      u->guessed_scheme = FALSE;
      break;
    case CURLUPART_USER:
      storep = &u->user;
      break;
    case CURLUPART_PASSWORD:
      storep = &u->password;
      break;
    case CURLUPART_OPTIONS:
      storep = &u->options;
      break;
    case CURLUPART_HOST:
      storep = &u->host;
      break;
    case CURLUPART_ZONEID:
      storep = &u->zoneid;
      break;
    case CURLUPART_PORT:
      u->portnum = 0;
      storep = &u->port;
      break;
    case CURLUPART_PATH:
      storep = &u->path;
      break;
    case CURLUPART_QUERY:
      storep = &u->query;
      u->query_present = FALSE;
      break;
    case CURLUPART_FRAGMENT:
      storep = &u->fragment;
      u->fragment_present = FALSE;
      break;
    default:
      return CURLUE_UNKNOWN_PART;
    }
    if(storep && *storep) {
      Curl_safefree(*storep);
    }
    else if(!storep) {
      free_urlhandle(u);
      memset(u, 0, sizeof(struct Curl_URL));
    }
    return CURLUE_OK;
  }

  nalloc = strlen(part);
  if(nalloc > CURL_MAX_INPUT_LENGTH)
    /* excessive input length */
    return CURLUE_MALFORMED_INPUT;

  switch(what) {
  case CURLUPART_SCHEME: {
    size_t plen = strlen(part);
    const char *s = part;
    if((plen > MAX_SCHEME_LEN) || (plen < 1))
      /* too long or too short */
      return CURLUE_BAD_SCHEME;
   /* verify that it is a fine scheme */
    if(!(flags & CURLU_NON_SUPPORT_SCHEME) && !Curl_get_scheme_handler(part))
      return CURLUE_UNSUPPORTED_SCHEME;
    storep = &u->scheme;
    urlencode = FALSE; /* never */
    if(ISALPHA(*s)) {
      /* ALPHA *( ALPHA / DIGIT / "+" / "-" / "." ) */
      while(--plen) {
        if(ISALNUM(*s) || (*s == '+') || (*s == '-') || (*s == '.'))
          s++; /* fine */
        else
          return CURLUE_BAD_SCHEME;
      }
    }
    else
      return CURLUE_BAD_SCHEME;
    u->guessed_scheme = FALSE;
    break;
  }
  case CURLUPART_USER:
    storep = &u->user;
    break;
  case CURLUPART_PASSWORD:
    storep = &u->password;
    break;
  case CURLUPART_OPTIONS:
    storep = &u->options;
    break;
  case CURLUPART_HOST:
    storep = &u->host;
    Curl_safefree(u->zoneid);
    break;
  case CURLUPART_ZONEID:
    storep = &u->zoneid;
    break;
  case CURLUPART_PORT:
    if(!ISDIGIT(part[0]))
      /* not a number */
      return CURLUE_BAD_PORT_NUMBER;
    else {
      char *tmp;
      curl_off_t port;
      if(Curl_str_number(&part, &port, 0xffff) || *part)
        /* weirdly provided number, not good! */
        return CURLUE_BAD_PORT_NUMBER;
      tmp = aprintf("%" CURL_FORMAT_CURL_OFF_T, port);
      if(!tmp)
        return CURLUE_OUT_OF_MEMORY;
      free(u->port);
      u->port = tmp;
      u->portnum = (unsigned short)port;
      return CURLUE_OK;
    }
  case CURLUPART_PATH:
    urlskipslash = TRUE;
    leadingslash = TRUE; /* enforce */
    storep = &u->path;
    break;
  case CURLUPART_QUERY:
    plusencode = urlencode;
    appendquery = (flags & CURLU_APPENDQUERY) ? 1 : 0;
    equalsencode = appendquery;
    storep = &u->query;
    u->query_present = TRUE;
    break;
  case CURLUPART_FRAGMENT:
    storep = &u->fragment;
    u->fragment_present = TRUE;
    break;
  case CURLUPART_URL: {
    /*
     * Allow a new URL to replace the existing (if any) contents.
     *
     * If the existing contents is enough for a URL, allow a relative URL to
     * replace it.
     */
    CURLUcode uc;
    char *oldurl;

    if(!nalloc)
      /* a blank URL is not a valid URL */
      return CURLUE_MALFORMED_INPUT;

    /* if the new thing is absolute or the old one is not (we could not get an
     * absolute URL in 'oldurl'), then replace the existing with the new. */
    if(Curl_is_absolute_url(part, NULL, 0,
                            flags & (CURLU_GUESS_SCHEME|CURLU_DEFAULT_SCHEME))
       || curl_url_get(u, CURLUPART_URL, &oldurl, flags)) {
      return parseurl_and_replace(part, u, flags);
    }
    DEBUGASSERT(oldurl); /* it is set here */
    /* apply the relative part to create a new URL */
    uc = redirect_url(oldurl, part, u, flags);
    free(oldurl);
    return uc;
  }
  default:
    return CURLUE_UNKNOWN_PART;
  }
  DEBUGASSERT(storep);
  {
    const char *newp;
    struct dynbuf enc;
    Curl_dyn_init(&enc, nalloc * 3 + 1 + leadingslash);

    if(leadingslash && (part[0] != '/')) {
      CURLcode result = Curl_dyn_addn(&enc, "/", 1);
      if(result)
        return cc2cu(result);
    }
    if(urlencode) {
      const unsigned char *i;

      for(i = (const unsigned char *)part; *i; i++) {
        CURLcode result;
        if((*i == ' ') && plusencode) {
          result = Curl_dyn_addn(&enc, "+", 1);
          if(result)
            return CURLUE_OUT_OF_MEMORY;
        }
        else if(ISUNRESERVED(*i) ||
                ((*i == '/') && urlskipslash) ||
                ((*i == '=') && equalsencode)) {
          if((*i == '=') && equalsencode)
            /* only skip the first equals sign */
            equalsencode = FALSE;
          result = Curl_dyn_addn(&enc, i, 1);
          if(result)
            return cc2cu(result);
        }
        else {
          unsigned char out[3]={'%'};
          Curl_hexbyte(&out[1], *i, TRUE);
          result = Curl_dyn_addn(&enc, out, 3);
          if(result)
            return cc2cu(result);
        }
      }
    }
    else {
      char *p;
      CURLcode result = Curl_dyn_add(&enc, part);
      if(result)
        return cc2cu(result);
      p = Curl_dyn_ptr(&enc);
      while(*p) {
        /* make sure percent encoded are lower case */
        if((*p == '%') && ISXDIGIT(p[1]) && ISXDIGIT(p[2]) &&
           (ISUPPER(p[1]) || ISUPPER(p[2]))) {
          p[1] = Curl_raw_tolower(p[1]);
          p[2] = Curl_raw_tolower(p[2]);
          p += 3;
        }
        else
          p++;
      }
    }
    newp = Curl_dyn_ptr(&enc);

    if(appendquery && newp) {
      /* Append the 'newp' string onto the old query. Add a '&' separator if
         none is present at the end of the existing query already */

      size_t querylen = u->query ? strlen(u->query) : 0;
      bool addamperand = querylen && (u->query[querylen -1] != '&');
      if(querylen) {
        struct dynbuf qbuf;
        Curl_dyn_init(&qbuf, CURL_MAX_INPUT_LENGTH);

        if(Curl_dyn_addn(&qbuf, u->query, querylen)) /* add original query */
          goto nomem;

        if(addamperand) {
          if(Curl_dyn_addn(&qbuf, "&", 1))
            goto nomem;
        }
        if(Curl_dyn_add(&qbuf, newp))
          goto nomem;
        Curl_dyn_free(&enc);
        free(*storep);
        *storep = Curl_dyn_ptr(&qbuf);
        return CURLUE_OK;
nomem:
        Curl_dyn_free(&enc);
        return CURLUE_OUT_OF_MEMORY;
      }
    }

    else if(what == CURLUPART_HOST) {
      size_t n = Curl_dyn_len(&enc);
      if(!n && (flags & CURLU_NO_AUTHORITY)) {
        /* Skip hostname check, it is allowed to be empty. */
      }
      else {
        bool bad = FALSE;
        if(!n)
          bad = TRUE; /* empty hostname is not okay */
        else if(!urlencode) {
          /* if the host name part was not URL encoded here, it was set ready
             URL encoded so we need to decode it to check */
          size_t dlen;
          char *decoded = NULL;
          CURLcode result =
            Curl_urldecode(newp, n, &decoded, &dlen, REJECT_CTRL);
          if(result || hostname_check(u, decoded, dlen))
            bad = TRUE;
          free(decoded);
        }
        else if(hostname_check(u, (char *)CURL_UNCONST(newp), n))
          bad = TRUE;
        if(bad) {
          Curl_dyn_free(&enc);
          return CURLUE_BAD_HOSTNAME;
        }
      }
    }

    free(*storep);
    *storep = (char *)CURL_UNCONST(newp);
  }
  return CURLUE_OK;
}